

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder.cc
# Opt level: O2

bool __thiscall
S2Builder::EdgeChainSimplifier::AvoidSites
          (EdgeChainSimplifier *this,VertexId v0,VertexId v1,VertexId v2,
          S2PolylineSimplifier *simplifier)

{
  pointer pVVar1;
  S2Builder *pSVar2;
  pointer pcVar3;
  bool bVar4;
  int iVar5;
  VertexOutEdgeIds VVar6;
  VertexOutEdgeIds VVar7;
  S1ChordAngle SVar8;
  S2Point *y;
  EdgeId e;
  S2Point *y_00;
  uint uVar9;
  S2Point *y_01;
  ulong uVar10;
  anon_union_8_2_a5b77b59_for_compact_array_base<int,_std::allocator<int>_>_13 *paVar11;
  S2Point *x;
  S1ChordAngle r;
  ostream *local_58;
  S1ChordAngle r2;
  S1ChordAngle r1;
  
  pVVar1 = (this->g_->vertices_->
           super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>)._M_impl.
           super__Vector_impl_data._M_start;
  x = pVVar1 + v0;
  y = pVVar1 + v1;
  y_01 = pVVar1 + v2;
  S1ChordAngle::S1ChordAngle(&r1,x,y);
  S1ChordAngle::S1ChordAngle(&r2,x,y_01);
  if ((r2.length2_ < r1.length2_) ||
     (pSVar2 = this->builder_, (pSVar2->min_edge_length_to_split_ca_).length2_ <= r2.length2_)) {
LAB_001f404c:
    bVar4 = false;
  }
  else {
    VVar6 = Graph::VertexOutMap::edge_ids(&this->out_,v1,v2);
    uVar9 = 0xffffffff;
    VVar7 = VVar6;
    while (iVar5 = VVar7.begin_, iVar5 != VVar6.end_) {
      Graph::input_edge_ids((IdSet *)&r,this->g_,iVar5);
      for (SVar8 = r; (ostream *)SVar8.length2_ != local_58;
          SVar8.length2_ = (double)((long)&((ostream *)SVar8.length2_)->_vptr_basic_ostream + 4)) {
        if (((int)uVar9 < 0) ||
           (pcVar3 = (pSVar2->edge_sites_).
                     super__Vector_base<gtl::compact_array<int,_std::allocator<int>_>,_std::allocator<gtl::compact_array<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
           (*(uint *)&pcVar3[(int)*(uint *)&((ostream *)SVar8.length2_)->_vptr_basic_ostream].
                      super_compact_array_base<int,_std::allocator<int>_> & 0xffffff) <
           (*(uint *)&pcVar3[uVar9].super_compact_array_base<int,_std::allocator<int>_> & 0xffffff))
           ) {
          uVar9 = *(uint *)&((ostream *)SVar8.length2_)->_vptr_basic_ostream;
        }
      }
      VVar7.begin_ = iVar5 + 1;
      VVar7.end_ = 0;
    }
    VVar7 = Graph::VertexOutMap::edge_ids(&this->out_,v2,v1);
    VVar6 = VVar7;
    while (iVar5 = VVar6.begin_, iVar5 != VVar7.end_) {
      Graph::input_edge_ids((IdSet *)&r,this->g_,iVar5);
      for (SVar8 = r; (ostream *)SVar8.length2_ != local_58;
          SVar8.length2_ = (double)((long)&((ostream *)SVar8.length2_)->_vptr_basic_ostream + 4)) {
        if (((int)uVar9 < 0) ||
           (pcVar3 = (pSVar2->edge_sites_).
                     super__Vector_base<gtl::compact_array<int,_std::allocator<int>_>,_std::allocator<gtl::compact_array<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
           (*(uint *)&pcVar3[(int)*(uint *)&((ostream *)SVar8.length2_)->_vptr_basic_ostream].
                      super_compact_array_base<int,_std::allocator<int>_> & 0xffffff) <
           (*(uint *)&pcVar3[uVar9].super_compact_array_base<int,_std::allocator<int>_> & 0xffffff))
           ) {
          uVar9 = *(uint *)&((ostream *)SVar8.length2_)->_vptr_basic_ostream;
        }
      }
      VVar6.begin_ = iVar5 + 1;
      VVar6.end_ = 0;
    }
    if ((int)uVar9 < 0) {
      S2LogMessage::S2LogMessage
                ((S2LogMessage *)&r,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builder.cc"
                 ,0x684,kFatal,(ostream *)&std::cerr);
      std::operator<<(local_58,"Check failed: (best) >= (0) ");
      abort();
    }
    pcVar3 = (pSVar2->edge_sites_).
             super__Vector_base<gtl::compact_array<int,_std::allocator<int>_>,_std::allocator<gtl::compact_array<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (pcVar3[uVar9].super_compact_array_base<int,_std::allocator<int>_>.is_inlined_ == false) {
      paVar11 = (anon_union_8_2_a5b77b59_for_compact_array_base<int,_std::allocator<int>_>_13 *)
                pcVar3[uVar9].super_compact_array_base<int,_std::allocator<int>_>.field_7.pointer_;
    }
    else {
      paVar11 = &pcVar3[uVar9].super_compact_array_base<int,_std::allocator<int>_>.field_7;
    }
    uVar9 = *(uint *)&pcVar3[uVar9].super_compact_array_base<int,_std::allocator<int>_>;
    for (uVar10 = 0; (uVar9 & 0xffffff) << 2 != uVar10; uVar10 = uVar10 + 4) {
      iVar5 = *(int *)((long)paVar11 + uVar10);
      if (((iVar5 != v2) && (iVar5 != v0)) && (iVar5 != v1)) {
        y_00 = (this->g_->vertices_->
               super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>)._M_impl.
               super__Vector_impl_data._M_start + iVar5;
        S1ChordAngle::S1ChordAngle(&r,x,y_00);
        if ((r1.length2_ < r.length2_) && (r.length2_ < r2.length2_)) {
          if (v1 == v0) {
            iVar5 = s2pred::Sign(y,y_01,y_00);
            bVar4 = 0 < iVar5;
          }
          else {
            bVar4 = s2pred::OrderedCCW(x,y_01,y_00,y);
          }
          bVar4 = S2PolylineSimplifier::AvoidDisc
                            (simplifier,y_00,
                             (S1ChordAngle)(this->builder_->min_edge_site_separation_ca_).length2_,
                             bVar4);
          if (!bVar4) goto LAB_001f404c;
        }
      }
    }
    bVar4 = true;
  }
  return bVar4;
}

Assistant:

bool S2Builder::EdgeChainSimplifier::AvoidSites(
    VertexId v0, VertexId v1, VertexId v2,
    S2PolylineSimplifier* simplifier) const {
  const S2Point& p0 = g_.vertex(v0);
  const S2Point& p1 = g_.vertex(v1);
  const S2Point& p2 = g_.vertex(v2);
  S1ChordAngle r1(p0, p1);
  S1ChordAngle r2(p0, p2);

  // The distance from the start of the edge chain must increase monotonically
  // for each vertex, since we don't want to simplify chains that backtrack on
  // themselves (we want a parametric approximation, not a geometric one).
  if (r2 < r1) return false;

  // We also limit the maximum edge length in order to guarantee that the
  // simplified edge stays with max_edge_deviation() of all the input edges
  // that snap to it.
  if (r2 >= builder_.min_edge_length_to_split_ca_) return false;

  // Otherwise it is sufficient to consider the nearby sites (edge_sites_) for
  // a single input edge that snapped to (v1, v2) or (v2, v1).  This is
  // because each edge has a list of all sites within (max_edge_deviation +
  // min_edge_vertex_separation), and since the output edge is within
  // max_edge_deviation of all input edges, this list includes all sites
  // within min_edge_vertex_separation of the output edge.
  //
  // Usually there is only one edge to choose from, but it's not much more
  // effort to choose the edge with the shortest list of edge_sites_.
  InputEdgeId best = -1;
  const auto& edge_sites = builder_.edge_sites_;
  for (EdgeId e : out_.edge_ids(v1, v2)) {
    for (InputEdgeId id : g_.input_edge_ids(e)) {
      if (best < 0 || edge_sites[id].size() < edge_sites[best].size())
        best = id;
    }
  }
  for (EdgeId e : out_.edge_ids(v2, v1)) {
    for (InputEdgeId id : g_.input_edge_ids(e)) {
      if (best < 0 || edge_sites[id].size() < edge_sites[best].size())
        best = id;
    }
  }
  S2_DCHECK_GE(best, 0);  // Because there is at least one outgoing edge.

  for (VertexId v : edge_sites[best]) {
    // This test is optional since these sites are excluded below anyway.
    if (v == v0 || v == v1 || v == v2) continue;

    // We are only interested in sites whose distance from "p0" is in the
    // range (r1, r2).  Sites closer than "r1" have already been processed,
    // and sites further than "r2" aren't relevant yet.
    const S2Point& p = g_.vertex(v);
    S1ChordAngle r(p0, p);
    if (r <= r1 || r >= r2) continue;

    // We need to figure out whether this site is to the left or right of the
    // edge chain.  For the first edge this is easy.  Otherwise, since we are
    // only considering sites in the radius range (r1, r2), we can do this by
    // checking whether the site is to the left of the wedge (p0, p1, p2).
    bool disc_on_left = (v1 == v0) ? (s2pred::Sign(p1, p2, p) > 0)
                                   : s2pred::OrderedCCW(p0, p2, p, p1);
    if (!simplifier->AvoidDisc(p, builder_.min_edge_site_separation_ca_,
                               disc_on_left)) {
      return false;
    }
  }
  return true;
}